

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

QGraphicsItem * __thiscall QAbstractGraphicsShapeItem::opaqueArea(QAbstractGraphicsShapeItem *this)

{
  bool bVar1;
  ulong uVar2;
  long *in_RSI;
  QGraphicsItem *in_RDI;
  QGraphicsItem *unaff_retaddr;
  QAbstractGraphicsShapeItemPrivate *d;
  QGraphicsItem *in_stack_ffffffffffffffc8;
  QGraphicsItem *this_00;
  
  this_00 = in_RDI;
  d_func((QAbstractGraphicsShapeItem *)0x987d6e);
  uVar2 = QBrush::isOpaque();
  if ((uVar2 & 1) == 0) {
    QGraphicsItem::opaqueArea(in_stack_ffffffffffffffc8);
  }
  else {
    bVar1 = QGraphicsItem::isClipped(this_00);
    if (bVar1) {
      QGraphicsItem::clipPath(unaff_retaddr);
    }
    else {
      (**(code **)(*in_RSI + 0x20))(this_00);
    }
  }
  return in_RDI;
}

Assistant:

QPainterPath QAbstractGraphicsShapeItem::opaqueArea() const
{
    Q_D(const QAbstractGraphicsShapeItem);
    if (d->brush.isOpaque())
        return isClipped() ? clipPath() : shape();
    return QGraphicsItem::opaqueArea();
}